

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper4.cpp
# Opt level: O2

void test_static_all_records_random_all(planck_unit_test_t *tc)

{
  ion_dictionary_config_info_t config_info;
  ion_dictionary_config_info_t config_info_00;
  ion_dictionary_config_info_t config_info_01;
  ion_dictionary_config_info_t config_info_02;
  ion_dictionary_config_info_t config_info_03;
  Dictionary<int,_int> *pDVar1;
  
  config_info.type = key_type_numeric_signed;
  config_info.key_size = 4;
  config_info.id = 1;
  config_info.use_type = '\0';
  config_info._5_3_ = 0;
  config_info.value_size = 4;
  config_info.dictionary_size = 100;
  config_info.dictionary_type = dictionary_type_bpp_tree_t;
  config_info.dictionary_status = '\0';
  config_info._29_3_ = 0;
  pDVar1 = &BppTree<int,_int>::openDictionary(config_info,0,0)->super_Dictionary<int,_int>;
  test_cpp_wrapper_all_records_random(tc,pDVar1);
  if (pDVar1 != (Dictionary<int,_int> *)0x0) {
    Dictionary<int,_int>::~Dictionary(pDVar1);
  }
  operator_delete(pDVar1);
  config_info_00.type = key_type_numeric_signed;
  config_info_00.key_size = 4;
  config_info_00.id = 1;
  config_info_00.use_type = '\0';
  config_info_00._5_3_ = 0;
  config_info_00.value_size = 4;
  config_info_00.dictionary_size = 100;
  config_info_00.dictionary_type = dictionary_type_skip_list_t;
  config_info_00.dictionary_status = '\0';
  config_info_00._29_3_ = 0;
  pDVar1 = &SkipList<int,_int>::openDictionary(config_info_00,0,0)->super_Dictionary<int,_int>;
  test_cpp_wrapper_all_records_random(tc,pDVar1);
  if (pDVar1 != (Dictionary<int,_int> *)0x0) {
    Dictionary<int,_int>::~Dictionary(pDVar1);
  }
  operator_delete(pDVar1);
  config_info_01.type = key_type_numeric_signed;
  config_info_01.key_size = 4;
  config_info_01.id = 1;
  config_info_01.use_type = '\0';
  config_info_01._5_3_ = 0;
  config_info_01.value_size = 4;
  config_info_01.dictionary_size = 100;
  config_info_01.dictionary_type = dictionary_type_flat_file_t;
  config_info_01.dictionary_status = '\0';
  config_info_01._29_3_ = 0;
  pDVar1 = &FlatFile<int,_int>::openDictionary(config_info_01,0,0)->super_Dictionary<int,_int>;
  test_cpp_wrapper_all_records_random(tc,pDVar1);
  if (pDVar1 != (Dictionary<int,_int> *)0x0) {
    Dictionary<int,_int>::~Dictionary(pDVar1);
  }
  operator_delete(pDVar1);
  config_info_02.type = key_type_numeric_signed;
  config_info_02.key_size = 4;
  config_info_02.id = 1;
  config_info_02.use_type = '\0';
  config_info_02._5_3_ = 0;
  config_info_02.value_size = 4;
  config_info_02.dictionary_size = 0xa0;
  config_info_02.dictionary_type = dictionary_type_open_address_hash_t;
  config_info_02.dictionary_status = '\0';
  config_info_02._29_3_ = 0;
  pDVar1 = &OpenAddressHash<int,_int>::openDictionary(config_info_02,0,0)->
            super_Dictionary<int,_int>;
  test_cpp_wrapper_all_records_random(tc,pDVar1);
  if (pDVar1 != (Dictionary<int,_int> *)0x0) {
    Dictionary<int,_int>::~Dictionary(pDVar1);
  }
  operator_delete(pDVar1);
  config_info_03.type = key_type_numeric_signed;
  config_info_03.key_size = 4;
  config_info_03.id = 1;
  config_info_03.use_type = '\0';
  config_info_03._5_3_ = 0;
  config_info_03.value_size = 4;
  config_info_03.dictionary_size = 0xa0;
  config_info_03.dictionary_type = dictionary_type_open_address_file_hash_t;
  config_info_03.dictionary_status = '\0';
  config_info_03._29_3_ = 0;
  pDVar1 = &OpenAddressFileHash<int,_int>::openDictionary(config_info_03,0,0)->
            super_Dictionary<int,_int>;
  test_cpp_wrapper_all_records_random(tc,pDVar1);
  if (pDVar1 != (Dictionary<int,_int> *)0x0) {
    Dictionary<int,_int>::~Dictionary(pDVar1);
  }
  operator_delete(pDVar1);
  return;
}

Assistant:

void
test_static_all_records_random_all(
	planck_unit_test_t *tc
) {
	Dictionary<int, int> *dict;

	ion_dictionary_config_info_t config = {
		.id = 1, .use_type = 0, .type = key_type_numeric_signed, .key_size = sizeof(int), .value_size = sizeof(int), .dictionary_size = 100, .dictionary_type = dictionary_type_bpp_tree_t, .dictionary_status = err_ok
	};

	int type = 0;

	dict = BppTree<int, int>::openDictionary(config, type, type);
	test_cpp_wrapper_all_records_random(tc, dict);
	delete dict;

	config.dictionary_type	= dictionary_type_skip_list_t;

	dict					= SkipList<int, int>::openDictionary(config, type, type);
	test_cpp_wrapper_all_records_random(tc, dict);
	delete dict;

	config.dictionary_type	= dictionary_type_flat_file_t;

	dict					= FlatFile<int, int>::openDictionary(config, type, type);
	test_cpp_wrapper_all_records_random(tc, dict);
	delete dict;

	config.dictionary_size	= 160;
	config.dictionary_type	= dictionary_type_open_address_hash_t;

	dict					= OpenAddressHash<int, int>::openDictionary(config, type, type);
	test_cpp_wrapper_all_records_random(tc, dict);
	delete dict;

	config.dictionary_type	= dictionary_type_open_address_file_hash_t;

	dict					= OpenAddressFileHash<int, int>::openDictionary(config, type, type);
	test_cpp_wrapper_all_records_random(tc, dict);
	delete dict;

	/* Uncomment when LinearHash dictionary open memory issue fixed. */
/*	config.dictionary_size = 100; */
/*	config.dictionary_type = dictionary_type_linear_hash_t; */
/*  */
/*	dict = LinearHash<int, int>::openDictionary(config, type, type); */
/*	test_cpp_wrapper_all_records_random(tc, dict); */
/*	delete dict; */
}